

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vepu5xx_common.c
# Opt level: O1

VepuRgb2YuvCfg * get_rgb2yuv_cfg(MppFrameColorRange range,MppFrameColorSpace color)

{
  VepuRgb2YuvCfg *pVVar1;
  long lVar2;
  
  if (range == MPP_FRAME_RANGE_JPEG) {
    pVVar1 = vepu_rgb2full_yuv_cfg_set;
  }
  else {
    pVVar1 = vepu_rgb2limit_yuv_cfg_set;
  }
  lVar2 = 0;
  do {
    if (*(MppFrameColorSpace *)((long)&pVVar1->color + lVar2) == color) {
      return (VepuRgb2YuvCfg *)((long)&pVVar1->color + lVar2);
    }
    lVar2 = lVar2 + 0x20;
  } while (lVar2 == 0x20);
  return pVVar1;
}

Assistant:

const VepuRgb2YuvCfg *get_rgb2yuv_cfg(MppFrameColorRange range, MppFrameColorSpace color)
{
    const VepuRgb2YuvCfg *cfg;
    RK_U32 size;
    RK_U32 i;

    /* only jpeg full range, others limit range */
    if (range == MPP_FRAME_RANGE_JPEG) {
        /* set default cfg BT.601 */
        cfg = &vepu_rgb2full_yuv_cfg_set[0];
        size = MPP_ARRAY_ELEMS(vepu_rgb2full_yuv_cfg_set);
    } else {
        /* set default cfg BT.601 */
        cfg = &vepu_rgb2limit_yuv_cfg_set[0];
        size = MPP_ARRAY_ELEMS(vepu_rgb2limit_yuv_cfg_set);
    }

    for (i = 0; i < size; i++)
        if (cfg[i].color == color)
            return &cfg[i];

    return cfg;
}